

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O2

Formula * __thiscall Kernel::FormulaTransformer::applyNot(FormulaTransformer *this,Formula *f)

{
  Formula *f_00;
  
  f_00 = apply(this,*(Formula **)(f + 1));
  if (f_00 != *(Formula **)(f + 1)) {
    if (f_00->_connective == NOT) {
      f = *(Formula **)(f_00 + 1);
    }
    else {
      f = (Formula *)NegatedFormula::operator_new(0x30);
      NegatedFormula::NegatedFormula((NegatedFormula *)f,f_00);
    }
  }
  return &((NegatedFormula *)f)->super_Formula;
}

Assistant:

Formula* FormulaTransformer::applyNot(Formula* f)
{
  Formula* newArg = apply(f->uarg());
  if(newArg==f->uarg()) {
    return f;
  }
  if(newArg->connective()==NOT) {
    return newArg->uarg();
  }
  return new NegatedFormula(newArg);
}